

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalAsOfJoin::GetData
          (PhysicalAsOfJoin *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  AsOfProbeBuffer *this_00;
  __pthread_list_t *p_Var1;
  __pthread_internal_list **pp_Var2;
  vector<duckdb::InterruptState,_true> *pvVar3;
  GlobalSourceState *pGVar4;
  AsOfLocalSourceState *this_01;
  _func_int **pp_Var5;
  ClientContext *context_00;
  _func_int *p_Var6;
  _func_int *p_Var7;
  bool *pbVar8;
  bool bVar9;
  type pPVar10;
  pointer this_02;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar11;
  Allocator *allocator;
  pointer pPVar12;
  idx_t iVar13;
  reference pvVar14;
  const_reference pvVar15;
  size_type sVar16;
  reference pvVar17;
  const_reference pvVar18;
  reference other;
  idx_t iVar19;
  unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true> *this_03;
  ExecutionContext *context_01;
  pointer __n;
  idx_t col_idx_1;
  ulong __n_00;
  SourceResultType SVar20;
  idx_t col_idx;
  ExecutionContext *pEVar21;
  size_type sVar22;
  idx_t local_a8;
  SelectionVector rsel;
  DataChunk rhs_chunk;
  
  pGVar4 = input->global_state;
  this_01 = (AsOfLocalSourceState *)input->local_state;
  pp_Var5 = pGVar4[1]._vptr_GlobalSourceState;
  context_00 = context->client;
  context_01 = context;
  bVar9 = AsOfLocalSourceState::CombineLeftPartitions(this_01);
  if ((bVar9) && (bVar9 = AsOfLocalSourceState::MergeLeftPartitions(this_01), bVar9)) {
    pPVar10 = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
              ::operator*((unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
                           *)(pGVar4[1]._vptr_GlobalSourceState + 0x32));
    pEVar21 = (ExecutionContext *)0x1;
    if ((pPVar10->grouping_data).
        super_unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RadixPartitionedTupleData_*,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        .super__Head_base<0UL,_duckdb::RadixPartitionedTupleData_*,_false>._M_head_impl !=
        (RadixPartitionedTupleData *)0x0) {
      this_02 = unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>,_true>
                ::operator->(&pPVar10->grouping_data);
      puVar11 = PartitionedTupleData::GetPartitions(&this_02->super_PartitionedTupleData);
      pEVar21 = (ExecutionContext *)
                ((long)(puVar11->
                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(puVar11->
                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    this_00 = &this_01->probe_buffer;
LAB_009b128a:
    if ((ExecutionContext *)
        pGVar4[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __next < pEVar21) {
      if ((this_01->probe_buffer).lhs_scanner.
          super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
          _M_t.
          super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
          .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl ==
          (PayloadScanner *)0x0) {
        LOCK();
        p_Var1 = &pGVar4[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                  __list;
        context_01 = (ExecutionContext *)p_Var1->__prev;
        p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + 1);
        UNLOCK();
        if (pEVar21 <= context_01) {
          bVar9 = IsRightOuterJoin((this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                                   super_CachingPhysicalOperator.field_0x81);
          if ((!bVar9) || (((context_00->interrupted)._M_base._M_i & 1U) != 0)) {
            return FINISHED;
          }
          TaskScheduler::GetScheduler(context_00);
          TaskScheduler::YieldThread();
          goto LAB_009b128a;
        }
        AsOfProbeBuffer::BeginLeftScan(this_00,(hash_t)context_01);
      }
      AsOfProbeBuffer::GetData(this_00,context_01,chunk);
      if (chunk->count != 0) {
        return HAVE_MORE_OUTPUT;
      }
      bVar9 = AsOfProbeBuffer::HasMoreData(this_00);
      if (!bVar9) {
        AsOfProbeBuffer::EndLeftScan(this_00);
        LOCK();
        pp_Var2 = &pGVar4[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                   __list.__next;
        *pp_Var2 = (__pthread_internal_list *)((long)&(*pp_Var2)->__prev + 1);
        UNLOCK();
      }
      goto LAB_009b128a;
    }
    bVar9 = IsRightOuterJoin((this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                             super_CachingPhysicalOperator.field_0x81);
    if (bVar9) {
      p_Var6 = pp_Var5[0x22];
      p_Var7 = pp_Var5[0x21];
      DataChunk::DataChunk(&rhs_chunk);
      allocator = Allocator::Get(context->client);
      DataChunk::Initialize
                (&rhs_chunk,allocator,(vector<duckdb::LogicalType,_true> *)(pp_Var5 + 0x1e),0x800);
      SelectionVector::SelectionVector(&rsel,0x800);
      this_03 = &this_01->scanner;
LAB_009b13c3:
      if (chunk->count == 0) {
        do {
          if ((this_03->
              super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
              .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl !=
              (PayloadScanner *)0x0) {
            pPVar12 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                      ::operator->(this_03);
            iVar13 = PayloadScanner::Remaining(pPVar12);
            if (iVar13 != 0) goto LAB_009b1463;
          }
          ::std::
          __uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
          reset((__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                 *)this_03,(pointer)0x0);
          ::std::
          __uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          ::reset((__uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                   *)&this_01->hash_group,(pointer)0x0);
          LOCK();
          pvVar3 = &pGVar4[1].super_StateWithBlockableTasks.blocked_tasks;
          __n = (pvVar3->
                super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
                super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                _M_impl.super__Vector_impl_data._M_start;
          (pvVar3->super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
          super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)&((pvVar3->
                          super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                          ).
                          super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
          UNLOCK();
          if ((pointer)((long)p_Var6 - (long)p_Var7 >> 3) <= __n) goto LAB_009b1553;
          while ((__n < (pointer)((long)pp_Var5[0x22] - (long)pp_Var5[0x21] >> 3) &&
                 (pvVar14 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                            ::get<true>((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                                         *)(pp_Var5 + 0x21),(size_type)__n),
                 (pvVar14->
                 super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                 .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl ==
                 (PartitionGlobalHashGroup *)0x0))) {
            LOCK();
            pvVar3 = &pGVar4[1].super_StateWithBlockableTasks.blocked_tasks;
            __n = (pvVar3->
                  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
                  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            (pvVar3->super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
            super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)&((pvVar3->
                            super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                            ).
                            super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
            UNLOCK();
          }
          AsOfLocalSourceState::BeginRightScan(this_01,(idx_t)__n);
        } while( true );
      }
      goto LAB_009b15fa;
    }
  }
  return FINISHED;
LAB_009b1463:
  pPVar12 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(this_03);
  iVar13 = PayloadScanner::Scanned(pPVar12);
  pPVar12 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(this_03);
  PayloadScanner::Scan(pPVar12,&rhs_chunk);
  if (rhs_chunk.count == 0) {
LAB_009b1553:
    SVar20 = FINISHED;
    goto LAB_009b1556;
  }
  pbVar8 = this_01->found_match;
  local_a8 = 0;
  for (iVar19 = 0; rhs_chunk.count != iVar19; iVar19 = iVar19 + 1) {
    if (pbVar8[iVar19 + iVar13] == false) {
      rsel.sel_vector[local_a8] = (sel_t)iVar19;
      local_a8 = local_a8 + 1;
    }
  }
  if (local_a8 != 0) {
    pvVar15 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                        (&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                          super_CachingPhysicalOperator.super_PhysicalOperator.children,0);
    sVar16 = ((long)(pvVar15->_M_data->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar15->_M_data->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
    for (sVar22 = 0; sVar16 != sVar22; sVar22 = sVar22 + 1) {
      pvVar17 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,sVar22);
      Vector::SetVectorType(pvVar17,CONSTANT_VECTOR);
      pvVar17 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,sVar22);
      ConstantVector::SetNull(pvVar17,true);
    }
    for (__n_00 = 0;
        __n_00 < (ulong)((long)(this->right_projection_map).
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->right_projection_map).
                               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3); __n_00 = __n_00 + 1)
    {
      pvVar18 = vector<unsigned_long,_true>::get<true>(&this->right_projection_map,__n_00);
      sVar22 = *pvVar18;
      pvVar17 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,sVar16 + __n_00);
      other = vector<duckdb::Vector,_true>::get<true>(&rhs_chunk.data,sVar22);
      Vector::Slice(pvVar17,other,&rsel,local_a8);
    }
    chunk->count = local_a8;
LAB_009b15fa:
    SVar20 = HAVE_MORE_OUTPUT;
LAB_009b1556:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rsel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    DataChunk::~DataChunk(&rhs_chunk);
    return SVar20;
  }
  goto LAB_009b13c3;
}

Assistant:

SourceResultType PhysicalAsOfJoin::GetData(ExecutionContext &context, DataChunk &chunk,
                                           OperatorSourceInput &input) const {
	auto &gsource = input.global_state.Cast<AsOfGlobalSourceState>();
	auto &lsource = input.local_state.Cast<AsOfLocalSourceState>();
	auto &rhs_sink = gsource.gsink.rhs_sink;
	auto &client = context.client;

	//	Step 1: Combine the partitions
	if (!lsource.CombineLeftPartitions()) {
		return SourceResultType::FINISHED;
	}

	//	Step 2: Sort on all threads
	if (!lsource.MergeLeftPartitions()) {
		return SourceResultType::FINISHED;
	}

	//	Step 3: Join the partitions
	auto &lhs_sink = *gsource.gsink.lhs_sink;
	const auto left_bins = lhs_sink.grouping_data ? lhs_sink.grouping_data->GetPartitions().size() : 1;
	while (gsource.flushed < left_bins) {
		//	Make sure we have something to flush
		if (!lsource.probe_buffer.Scanning()) {
			const auto left_bin = gsource.next_left++;
			if (left_bin < left_bins) {
				//	More to flush
				lsource.probe_buffer.BeginLeftScan(left_bin);
			} else if (!IsRightOuterJoin(join_type) || client.interrupted) {
				return SourceResultType::FINISHED;
			} else {
				//	Wait for all threads to finish
				//	TODO: How to implement a spin wait correctly?
				//	Returning BLOCKED seems to hang the system.
				TaskScheduler::GetScheduler(client).YieldThread();
				continue;
			}
		}

		lsource.probe_buffer.GetData(context, chunk);
		if (chunk.size()) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		} else if (lsource.probe_buffer.HasMoreData()) {
			//	Join the next partition
			continue;
		} else {
			lsource.probe_buffer.EndLeftScan();
			gsource.flushed++;
		}
	}

	//	Step 4: Emit right join matches
	if (!IsRightOuterJoin(join_type)) {
		return SourceResultType::FINISHED;
	}

	auto &hash_groups = rhs_sink.hash_groups;
	const auto right_groups = hash_groups.size();

	DataChunk rhs_chunk;
	rhs_chunk.Initialize(Allocator::Get(context.client), rhs_sink.payload_types);
	SelectionVector rsel(STANDARD_VECTOR_SIZE);

	while (chunk.size() == 0) {
		//	Move to the next bin if we are done.
		while (!lsource.scanner || !lsource.scanner->Remaining()) {
			lsource.scanner.reset();
			lsource.hash_group.reset();
			auto hash_bin = gsource.next_right++;
			if (hash_bin >= right_groups) {
				return SourceResultType::FINISHED;
			}

			for (; hash_bin < hash_groups.size(); hash_bin = gsource.next_right++) {
				if (hash_groups[hash_bin]) {
					break;
				}
			}
			lsource.BeginRightScan(hash_bin);
		}
		const auto rhs_position = lsource.scanner->Scanned();
		lsource.scanner->Scan(rhs_chunk);

		const auto count = rhs_chunk.size();
		if (count == 0) {
			return SourceResultType::FINISHED;
		}

		// figure out which tuples didn't find a match in the RHS
		auto found_match = lsource.found_match;
		idx_t result_count = 0;
		for (idx_t i = 0; i < count; i++) {
			if (!found_match[rhs_position + i]) {
				rsel.set_index(result_count++, i);
			}
		}

		if (result_count > 0) {
			// if there were any tuples that didn't find a match, output them
			const idx_t left_column_count = children[0].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < left_column_count; ++col_idx) {
				chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(chunk.data[col_idx], true);
			}
			for (idx_t col_idx = 0; col_idx < right_projection_map.size(); ++col_idx) {
				const auto rhs_idx = right_projection_map[col_idx];
				chunk.data[left_column_count + col_idx].Slice(rhs_chunk.data[rhs_idx], rsel, result_count);
			}
			chunk.SetCardinality(result_count);
			break;
		}
	}

	return chunk.size() > 0 ? SourceResultType::HAVE_MORE_OUTPUT : SourceResultType::FINISHED;
}